

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O1

void rdmsr_(PDISASM pMyDisasm)

{
  undefined4 uVar1;
  long lVar2;
  
  if ((pMyDisasm->Reserved_).VEX.state == '\x01') {
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"???",4);
    (pMyDisasm->Operand1).AccessMode = 0;
    (pMyDisasm->Operand2).AccessMode = 0;
    (pMyDisasm->Operand3).AccessMode = 0;
    (pMyDisasm->Operand4).AccessMode = 0;
    (pMyDisasm->Operand5).AccessMode = 0;
    (pMyDisasm->Operand6).AccessMode = 0;
    (pMyDisasm->Operand7).AccessMode = 0;
    (pMyDisasm->Operand8).AccessMode = 0;
    (pMyDisasm->Operand9).AccessMode = 0;
    uVar1 = 0xffffffff;
    lVar2 = 0x924;
  }
  else {
    (pMyDisasm->Instruction).Category = 0xa0000;
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"rdmsr",6);
    (pMyDisasm->Reserved_).EIP_ = (pMyDisasm->Reserved_).EIP_ + 1;
    (pMyDisasm->Operand1).OpType = 0x20000;
    (pMyDisasm->Operand1).Registers.type = 1;
    (pMyDisasm->Operand1).Registers.gpr = 5;
    (pMyDisasm->Operand1).OpSize = 0x20;
    (pMyDisasm->Operand2).OpType = 0x20000;
    (pMyDisasm->Operand2).Registers.type = 1;
    (pMyDisasm->Operand2).Registers.gpr = 2;
    uVar1 = 0x20;
    lVar2 = 0x284;
  }
  *(undefined4 *)(pMyDisasm->CompleteInstr + lVar2 + -0x14) = uVar1;
  return;
}

Assistant:

void __bea_callspec__ rdmsr_(PDISASM pMyDisasm)
{
  if (GV.VEX.state == InUsePrefix) {
    failDecode(pMyDisasm);
    return;
  }
  pMyDisasm->Instruction.Category = SYSTEM_INSTRUCTION;
  #ifndef BEA_LIGHT_DISASSEMBLY
     (void) strcpy (pMyDisasm->Instruction.Mnemonic, "rdmsr");
  #endif
  GV.EIP_++;
  pMyDisasm->Operand1.OpType = REGISTER_TYPE;
  pMyDisasm->Operand1.Registers.type = GENERAL_REG;
  pMyDisasm->Operand1.Registers.gpr = REG0+REG2;
  pMyDisasm->Operand1.OpSize = 32;
  pMyDisasm->Operand2.OpType = REGISTER_TYPE;
  pMyDisasm->Operand2.Registers.type = GENERAL_REG;
  pMyDisasm->Operand2.Registers.gpr = REG1;
  pMyDisasm->Operand2.OpSize = 32;
}